

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panning.cpp
# Opt level: O0

void anon_unknown.dwarf_1cab89::InitPanning(ALCdevice *device,bool hqdec,bool stablize)

{
  span<const_std::array<float,_16UL>,_18446744073709551615UL> coeffslf;
  span<const_std::array<float,_16UL>,_18446744073709551615UL> coeffs_00;
  FILE *__stream;
  bool bVar1;
  uint uVar2;
  index_type iVar3;
  reference pCVar4;
  char *pcVar5;
  size_type sVar6;
  const_reference pvVar7;
  reference pfVar8;
  reference pfVar9;
  const_iterator main_chans;
  const_iterator pvVar10;
  ALCdevice *device_00;
  iterator pvVar11;
  reference pvVar12;
  ulong uVar13;
  byte in_DL;
  byte in_SIL;
  long in_RDI;
  float fVar14;
  value_type_conflict *coeff_1;
  iterator __end4_1;
  iterator __begin4_1;
  value_type *__range4_1;
  value_type_conflict *coeff;
  iterator __end4;
  iterator __begin4;
  value_type *__range4;
  bool hasfc;
  value_type cidx;
  unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> stablizer;
  size_t ambicount;
  size_t count_2;
  ALuint o_1;
  size_t count_1;
  ALuint o;
  size_t start;
  span<float,_16UL> coeffs;
  ALuint idx;
  size_t i;
  vector<ChannelDec> chancoeffslf;
  vector<ChannelDec> chancoeffs;
  bool dual_band;
  float nfc_delay;
  size_t count;
  array<float,_16UL> *n3dscale;
  array<unsigned_char,_16UL> *acnmap;
  char *devname;
  DecoderView decoder;
  BFChannelConfig *in_stack_fffffffffffffc68;
  unique_ptr<BFormatDec,_std::default_delete<BFormatDec>_> *puVar15;
  RealMixParams *in_stack_fffffffffffffc70;
  array<float,_16UL> *in_stack_fffffffffffffc78;
  anon_class_8_1_c5b2e2a9 in_stack_fffffffffffffc80;
  span<const_std::array<float,_16UL>,_18446744073709551615UL> *psVar16;
  char *local_378;
  value_type *in_stack_fffffffffffffc90;
  size_type in_stack_fffffffffffffc98;
  vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
  *in_stack_fffffffffffffca0;
  undefined1 is3d;
  char *in_stack_fffffffffffffca8;
  ALCdevice *in_stack_fffffffffffffcb0;
  ALuint srate;
  DecoderConfig<((anonymous_namespace)::DecoderMode)1,_6UL> *in_stack_fffffffffffffcb8;
  DecoderConfig<((anonymous_namespace)::DecoderMode)1,_0UL> *in_stack_fffffffffffffcc0;
  array<unsigned_char,_7UL> *real_chans;
  size_t in_stack_fffffffffffffcc8;
  ALCdevice *in_stack_fffffffffffffcd0;
  reference in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  value_type_conflict in_stack_fffffffffffffcf4;
  pointer in_stack_fffffffffffffcf8;
  pointer in_stack_fffffffffffffd00;
  pointer in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd20;
  value_type_conflict in_stack_fffffffffffffd24;
  byte local_289;
  unique_ptr<BFormatDec,_std::default_delete<BFormatDec>_> local_248 [7];
  float *local_210;
  iterator local_208;
  float *local_200;
  reference local_1f8;
  float *local_1f0;
  iterator local_1e8;
  float *local_1e0;
  reference local_1d8;
  byte local_1cd;
  uint local_1cc;
  span<const_std::array<float,_16UL>,_18446744073709551615UL> *local_1b8;
  ulong local_1b0;
  uint local_1a4;
  pointer local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  ulong local_158;
  uint local_14c;
  index_type local_148;
  span<float,_16UL> local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  ALuint local_ec;
  ulong local_e8;
  undefined1 local_e0 [51];
  byte local_ad;
  undefined4 local_a0;
  float local_94;
  array<float,_16UL> *local_90;
  size_t local_88;
  array<float,_16UL> *local_80;
  array<unsigned_char,_16UL> *local_78;
  undefined8 local_70;
  uint local_68;
  span<const_Channel,_18446744073709551615UL> local_60;
  span<const_float,_18446744073709551615UL> local_50;
  span<const_std::array<float,_7UL>,_18446744073709551615UL> local_40;
  span<const_float,_18446744073709551615UL> local_30;
  span<const_std::array<float,_7UL>,_18446744073709551615UL> local_20;
  byte local_a;
  byte local_9;
  undefined8 local_8;
  
  local_9 = in_SIL & 1;
  local_a = in_DL & 1;
  local_68 = 0;
  local_60.mData = (pointer)0x0;
  local_60.mDataEnd = (pointer)0x0;
  local_8 = in_RDI;
  al::span<const_Channel,_18446744073709551615UL>::span(&local_60);
  local_50.mData = (pointer)0x0;
  local_50.mDataEnd = (pointer)0x0;
  al::span<const_float,_18446744073709551615UL>::span(&local_50);
  local_40.mData = (pointer)0x0;
  local_40.mDataEnd = (pointer)0x0;
  al::span<const_std::array<float,_7UL>,_18446744073709551615UL>::span(&local_40);
  local_30.mData = (pointer)0x0;
  local_30.mDataEnd = (pointer)0x0;
  al::span<const_float,_18446744073709551615UL>::span(&local_30);
  local_20.mData = (pointer)0x0;
  local_20.mDataEnd = (pointer)0x0;
  al::span<const_std::array<float,_7UL>,_18446744073709551615UL>::span(&local_20);
  switch(*(undefined1 *)(local_8 + 0x18)) {
  case 0:
    DecoderConfig<((anonymous_namespace)::DecoderMode)1,_0UL>::operator=<1UL>
              (in_stack_fffffffffffffcc0,
               (DecoderConfig<((anonymous_namespace)::DecoderMode)0,_1UL> *)
               in_stack_fffffffffffffcb8);
    break;
  case 1:
    DecoderConfig<((anonymous_namespace)::DecoderMode)1,_0UL>::operator=<2UL>
              (in_stack_fffffffffffffcc0,
               (DecoderConfig<((anonymous_namespace)::DecoderMode)0,_2UL> *)
               in_stack_fffffffffffffcb8);
    break;
  case 2:
    DecoderConfig<((anonymous_namespace)::DecoderMode)1,_0UL>::operator=<4UL>
              (in_stack_fffffffffffffcc0,
               (DecoderConfig<((anonymous_namespace)::DecoderMode)1,_4UL> *)
               in_stack_fffffffffffffcb8);
    break;
  case 3:
    DecoderConfig<((anonymous_namespace)::DecoderMode)1,_0UL>::operator=<4UL>
              (in_stack_fffffffffffffcc0,
               (DecoderConfig<((anonymous_namespace)::DecoderMode)0,_4UL> *)
               in_stack_fffffffffffffcb8);
    break;
  case 4:
    DecoderConfig<((anonymous_namespace)::DecoderMode)1,_0UL>::operator=<5UL>
              (in_stack_fffffffffffffcc0,
               (DecoderConfig<((anonymous_namespace)::DecoderMode)0,_5UL> *)
               in_stack_fffffffffffffcb8);
    break;
  case 5:
    DecoderConfig<((anonymous_namespace)::DecoderMode)1,_0UL>::operator=<6UL>
              (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    break;
  case 6:
    break;
  case 7:
    DecoderConfig<((anonymous_namespace)::DecoderMode)1,_0UL>::operator=<4UL>
              (in_stack_fffffffffffffcc0,
               (DecoderConfig<((anonymous_namespace)::DecoderMode)0,_4UL> *)
               in_stack_fffffffffffffcb8);
  }
  if (*(char *)(local_8 + 0x18) == '\x06') {
    local_70 = std::__cxx11::string::c_str();
    is3d = (undefined1)((ulong)in_stack_fffffffffffffca0 >> 0x38);
    local_78 = GetAmbiLayout(*(DevAmbiLayout *)(local_8 + 0x20) & ACN);
    local_80 = GetAmbiScales(*(DevAmbiScaling *)(local_8 + 0x21));
    local_88 = AmbiChannelsFromOrder((ulong)*(uint *)(local_8 + 0x1c));
    std::array<unsigned_char,_16UL>::begin((array<unsigned_char,_16UL> *)0x211d25);
    std::array<unsigned_char,_16UL>::begin((array<unsigned_char,_16UL> *)0x211d3a);
    std::begin<std::array<BFChannelConfig,16ul>>((array<BFChannelConfig,_16UL> *)0x211d61);
    local_90 = local_80;
    std::
    transform<unsigned_char_const*,BFChannelConfig*,(anonymous_namespace)::InitPanning(ALCdevice*,bool,bool)::__0>
              ((uchar *)in_stack_fffffffffffffc78,(uchar *)in_stack_fffffffffffffc70,
               in_stack_fffffffffffffc68,in_stack_fffffffffffffc80);
    AllocChannels(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
                  (size_t)in_stack_fffffffffffffcc0);
    ConfigValueFloat((char *)in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0,
                     in_stack_fffffffffffffca8);
    local_a0 = 0;
    fVar14 = al::optional<float>::value_or<float>
                       ((optional<float> *)in_stack_fffffffffffffc80.n3dscale,
                        in_stack_fffffffffffffc78->_M_elems);
    al::optional<float>::~optional((optional<float> *)in_stack_fffffffffffffc70);
    if (0.0 < fVar14) {
      local_94 = fVar14;
      InitNearFieldCtrl(in_stack_fffffffffffffcb0,(float)((ulong)in_stack_fffffffffffffca8 >> 0x20),
                        (ALuint)in_stack_fffffffffffffca8,(bool)is3d);
    }
  }
  else {
    local_289 = 0;
    if ((local_9 & 1) != 0) {
      bVar1 = al::span<const_std::array<float,_7UL>,_18446744073709551615UL>::empty(&local_20);
      local_289 = bVar1 ^ 0xff;
    }
    local_ad = local_289 & 1;
    std::vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>::vector
              ((vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_> *)
               0x211ed5);
    std::vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>::vector
              ((vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_> *)
               0x211ee2);
    for (local_e8 = 0; uVar13 = local_e8,
        iVar3 = al::span<const_Channel,_18446744073709551615UL>::size(&local_60), uVar13 < iVar3;
        local_e8 = local_e8 + 1) {
      al::span<const_Channel,_18446744073709551615UL>::operator[](&local_60,local_e8);
      local_ec = GetChannelIdxByName(in_stack_fffffffffffffc70,
                                     (Channel)((ulong)in_stack_fffffffffffffc68 >> 0x20));
      __stream = gLogFile;
      if (local_ec == 0xffffffff) {
        if (0 < (int)gLogLevel) {
          pCVar4 = al::span<const_Channel,_18446744073709551615UL>::operator[](&local_60,local_e8);
          pcVar5 = GetLabelFromChannel(*pCVar4);
          fprintf((FILE *)__stream,"[ALSOFT] (EE) Failed to find %s channel in device\n",pcVar5);
        }
      }
      else {
        sVar6 = std::vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>::
                size((vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                      *)(local_e0 + 0x18));
        maxz(sVar6,(ulong)(local_ec + 1));
        local_108 = 0;
        uStack_100 = 0;
        local_118 = 0;
        uStack_110 = 0;
        local_128 = 0;
        uStack_120 = 0;
        local_138 = 0;
        uStack_130 = 0;
        std::vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>::resize
                  (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
        std::vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>::
        operator[]((vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_> *)
                   (local_e0 + 0x18),(ulong)local_ec);
        al::span<float,_16UL>::span
                  ((span<float,_16UL> *)in_stack_fffffffffffffc80.n3dscale,in_stack_fffffffffffffc78
                  );
        local_148 = 0;
        for (local_14c = 0; local_14c <= local_68; local_14c = local_14c + 1) {
          uVar2 = 1;
          if (local_14c != 0) {
            uVar2 = 2;
          }
          local_158 = (ulong)uVar2;
          do {
            al::span<const_std::array<float,_7UL>,_18446744073709551615UL>::operator[]
                      (&local_40,local_e8);
            pvVar7 = std::array<float,_7UL>::operator[]
                               ((array<float,_7UL> *)in_stack_fffffffffffffc70,
                                (size_type)in_stack_fffffffffffffc68);
            in_stack_fffffffffffffd24 = *pvVar7;
            pfVar8 = al::span<const_float,_18446744073709551615UL>::operator[]
                               (&local_50,(ulong)local_14c);
            fVar14 = in_stack_fffffffffffffd24 * *pfVar8;
            pfVar9 = al::span<float,_16UL>::operator[](&local_140,local_148);
            *pfVar9 = fVar14;
            local_148 = local_148 + 1;
            local_158 = local_158 - 1;
          } while (local_158 != 0);
          local_158 = 0;
        }
        if ((local_ad & 1) != 0) {
          in_stack_fffffffffffffd08 = (pointer)local_e0;
          sVar6 = std::vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                  ::size((vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                          *)in_stack_fffffffffffffd08);
          maxz(sVar6,(ulong)(local_ec + 1));
          local_168 = 0;
          uStack_160 = 0;
          local_178 = 0;
          uStack_170 = 0;
          local_188 = 0;
          uStack_180 = 0;
          local_198 = 0;
          uStack_190 = 0;
          std::vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>::resize
                    (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
          std::vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>::
          operator[]((vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                      *)local_e0,(ulong)local_ec);
          al::span<float,_16UL>::span
                    ((span<float,_16UL> *)in_stack_fffffffffffffc80.n3dscale,
                     in_stack_fffffffffffffc78);
          local_140.mData = local_1a0;
          local_148 = 0;
          for (local_1a4 = 0; local_1a4 <= local_68; local_1a4 = local_1a4 + 1) {
            uVar2 = 1;
            if (local_1a4 != 0) {
              uVar2 = 2;
            }
            local_1b0 = (ulong)uVar2;
            do {
              in_stack_fffffffffffffd00 =
                   (pointer)al::span<const_std::array<float,_7UL>,_18446744073709551615UL>::
                            operator[](&local_20,local_e8);
              pvVar7 = std::array<float,_7UL>::operator[]
                                 ((array<float,_7UL> *)in_stack_fffffffffffffc70,
                                  (size_type)in_stack_fffffffffffffc68);
              in_stack_fffffffffffffcf4 = *pvVar7;
              in_stack_fffffffffffffcf8 =
                   (pointer)al::span<const_float,_18446744073709551615UL>::operator[]
                                      (&local_30,(ulong)local_1a4);
              fVar14 = in_stack_fffffffffffffcf4 * in_stack_fffffffffffffcf8->_M_elems[0];
              in_stack_fffffffffffffce8 = al::span<float,_16UL>::operator[](&local_140,local_148);
              *in_stack_fffffffffffffce8 = fVar14;
              local_148 = local_148 + 1;
              local_1b0 = local_1b0 - 1;
            } while (local_1b0 != 0);
            local_1b0 = 0;
          }
        }
      }
    }
    *(uint *)(local_8 + 0x1c) = local_68;
    local_1b8 = (span<const_std::array<float,_16UL>,_18446744073709551615UL> *)
                Ambi2DChannelsFromOrder((ulong)local_68);
    real_chans = &AmbiIndex::From2D;
    main_chans = std::array<unsigned_char,_7UL>::begin((array<unsigned_char,_7UL> *)0x212449);
    pvVar10 = std::array<unsigned_char,_7UL>::begin((array<unsigned_char,_7UL> *)0x212458);
    device_00 = (ALCdevice *)(pvVar10 + (long)local_1b8);
    pvVar11 = std::begin<std::array<BFChannelConfig,16ul>>((array<BFChannelConfig,_16UL> *)0x21247c)
    ;
    std::
    transform<unsigned_char_const*,BFChannelConfig*,(anonymous_namespace)::InitPanning(ALCdevice*,bool,bool)::__1>
              (main_chans,device_00,pvVar11);
    psVar16 = local_1b8;
    srate = local_8._4_4_;
    ALCdevice::channelsFromFmt((ALCdevice *)0x2124b8);
    AllocChannels(device_00,(size_t)main_chans,(size_t)real_chans);
    std::unique_ptr<FrontStablizer,std::default_delete<FrontStablizer>>::
    unique_ptr<std::default_delete<FrontStablizer>,void>
              ((unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> *)
               in_stack_fffffffffffffc70);
    if ((local_a & 1) != 0) {
      pvVar12 = std::array<unsigned_int,_16UL>::operator[]
                          ((array<unsigned_int,_16UL> *)in_stack_fffffffffffffc70,
                           (size_type)in_stack_fffffffffffffc68);
      local_1cc = *pvVar12;
      local_1cd = 0;
      uVar13 = (ulong)local_1cc;
      sVar6 = std::vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>::
              size((vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_> *)
                   (local_e0 + 0x18));
      if (uVar13 < sVar6) {
        local_1d8 = std::
                    vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>::
                    operator[]((vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                                *)(local_e0 + 0x18),(ulong)local_1cc);
        local_1e0 = std::array<float,_16UL>::begin((array<float,_16UL> *)0x21256b);
        local_1e8 = std::array<float,_16UL>::end((array<float,_16UL> *)0x212580);
        for (; local_1e0 != local_1e8; local_1e0 = local_1e0 + 1) {
          local_1f0 = local_1e0;
          local_1cd = (local_1cd & 1) != 0 || *local_1e0 != 0.0;
        }
      }
      if ((local_1cd & 1) == 0) {
        uVar13 = (ulong)local_1cc;
        sVar6 = std::vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>::
                size((vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                      *)local_e0);
        if (uVar13 < sVar6) {
          local_1f8 = std::
                      vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                      ::operator[]((vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                                    *)local_e0,(ulong)local_1cc);
          local_200 = std::array<float,_16UL>::begin((array<float,_16UL> *)0x212661);
          local_208 = std::array<float,_16UL>::end((array<float,_16UL> *)0x212676);
          for (; local_200 != local_208; local_200 = local_200 + 1) {
            local_210 = local_200;
            local_1cd = (local_1cd & 1) != 0 || *local_200 != 0.0;
          }
        }
      }
      if ((local_1cd & 1) == 0) {
        ALCdevice::channelsFromFmt((ALCdevice *)0x21270f);
        CreateStablizer((size_t)psVar16,srate);
        std::unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_>::operator=
                  ((unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> *)
                   in_stack_fffffffffffffc70,
                   (unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> *)
                   in_stack_fffffffffffffc68);
        std::unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_>::~unique_ptr
                  ((unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> *)
                   in_stack_fffffffffffffc80.n3dscale);
        if (2 < (int)gLogLevel) {
          fprintf((FILE *)gLogFile,"[ALSOFT] (II) Front stablizer enabled\n");
        }
      }
    }
    if (2 < (int)gLogLevel) {
      pcVar5 = "dual";
      if (((local_ad ^ 0xff) & 1) != 0) {
        pcVar5 = "single";
      }
      if (local_68 < 3) {
        local_378 = "first";
        if (1 < local_68) {
          local_378 = "second";
        }
      }
      else {
        local_378 = "third";
      }
      fprintf((FILE *)gLogFile,"[ALSOFT] (II) Enabling %s-band %s-order%s ambisonic decoder\n",
              pcVar5,local_378,"");
    }
    psVar16 = local_1b8;
    al::span<const_std::array<float,_16UL>,_18446744073709551615UL>::
    span<std::vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>,_true,_true>
              (local_1b8,
               (vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_> *)
               in_stack_fffffffffffffc78);
    al::span<const_std::array<float,_16UL>,_18446744073709551615UL>::
    span<std::vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>,_true,_true>
              (psVar16,(vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                        *)in_stack_fffffffffffffc78);
    puVar15 = local_248;
    std::unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_>::unique_ptr
              ((unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> *)
               in_stack_fffffffffffffc70,
               (unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> *)
               in_stack_fffffffffffffc68);
    coeffs_00.mDataEnd = in_stack_fffffffffffffd08;
    coeffs_00.mData = in_stack_fffffffffffffd00;
    coeffslf.mData._4_4_ = in_stack_fffffffffffffcf4;
    coeffslf.mData._0_4_ = in_stack_fffffffffffffcf0;
    coeffslf.mDataEnd = in_stack_fffffffffffffcf8;
    BFormatDec::Create((size_t)in_stack_fffffffffffffce8,coeffs_00,coeffslf,
                       (unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> *)
                       CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
    std::unique_ptr<BFormatDec,_std::default_delete<BFormatDec>_>::operator=
              ((unique_ptr<BFormatDec,_std::default_delete<BFormatDec>_> *)in_stack_fffffffffffffc70
               ,puVar15);
    std::unique_ptr<BFormatDec,_std::default_delete<BFormatDec>_>::~unique_ptr
              ((unique_ptr<BFormatDec,_std::default_delete<BFormatDec>_> *)in_stack_fffffffffffffc70
              );
    std::unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_>::~unique_ptr
              ((unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> *)psVar16);
    std::unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_>::~unique_ptr
              ((unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> *)psVar16);
    std::vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>::~vector
              ((vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_> *)
               psVar16);
    std::vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>::~vector
              ((vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_> *)
               psVar16);
  }
  return;
}

Assistant:

void InitPanning(ALCdevice *device, const bool hqdec=false, const bool stablize=false)
{
    DecoderView decoder{};
    switch(device->FmtChans)
    {
    case DevFmtMono:
        decoder = MonoConfig;
        break;
    case DevFmtStereo:
        decoder = StereoConfig;
        break;
    case DevFmtQuad:
        decoder = QuadConfig;
        break;
    case DevFmtX51:
        decoder = X51Config;
        break;
    case DevFmtX51Rear:
        decoder = X51RearConfig;
        break;
    case DevFmtX61:
        decoder = X61Config;
        break;
    case DevFmtX71:
        decoder = X71Config;
        break;
    case DevFmtAmbi3D:
        break;
    }

    if(device->FmtChans == DevFmtAmbi3D)
    {
        const char *devname{device->DeviceName.c_str()};
        const std::array<uint8_t,MAX_AMBI_CHANNELS> &acnmap = GetAmbiLayout(device->mAmbiLayout);
        const std::array<float,MAX_AMBI_CHANNELS> &n3dscale = GetAmbiScales(device->mAmbiScale);

        /* For DevFmtAmbi3D, the ambisonic order is already set. */
        const size_t count{AmbiChannelsFromOrder(device->mAmbiOrder)};
        std::transform(acnmap.begin(), acnmap.begin()+count, std::begin(device->Dry.AmbiMap),
            [&n3dscale](const uint8_t &acn) noexcept -> BFChannelConfig
            { return BFChannelConfig{1.0f/n3dscale[acn], acn}; }
        );
        AllocChannels(device, count, 0);

        float nfc_delay{ConfigValueFloat(devname, "decoder", "nfc-ref-delay").value_or(0.0f)};
        if(nfc_delay > 0.0f)
            InitNearFieldCtrl(device, nfc_delay * SpeedOfSoundMetersPerSec, device->mAmbiOrder,
                true);
    }
    else
    {
        const bool dual_band{hqdec && !decoder.mCoeffsLF.empty()};
        al::vector<ChannelDec> chancoeffs, chancoeffslf;
        for(size_t i{0u};i < decoder.mChannels.size();++i)
        {
            const ALuint idx{GetChannelIdxByName(device->RealOut, decoder.mChannels[i])};
            if(idx == INVALID_CHANNEL_INDEX)
            {
                ERR("Failed to find %s channel in device\n",
                    GetLabelFromChannel(decoder.mChannels[i]));
                continue;
            }

            chancoeffs.resize(maxz(chancoeffs.size(), idx+1u), ChannelDec{});
            al::span<float,MAX_AMBI_CHANNELS> coeffs{chancoeffs[idx]};
            size_t start{0};
            for(ALuint o{0};o <= decoder.mOrder;++o)
            {
                size_t count{o ? 2u : 1u};
                do {
                    coeffs[start] = decoder.mCoeffs[i][start] * decoder.mOrderGain[o];
                    ++start;
                } while(--count);
            }
            if(!dual_band)
                continue;

            chancoeffslf.resize(maxz(chancoeffslf.size(), idx+1u), ChannelDec{});
            coeffs = chancoeffslf[idx];
            start = 0;
            for(ALuint o{0};o <= decoder.mOrder;++o)
            {
                size_t count{o ? 2u : 1u};
                do {
                    coeffs[start] = decoder.mCoeffsLF[i][start] * decoder.mOrderGainLF[o];
                    ++start;
                } while(--count);
            }
        }

        /* For non-DevFmtAmbi3D, set the ambisonic order. */
        device->mAmbiOrder = decoder.mOrder;

        /* Built-in speaker decoders are always 2D. */
        const size_t ambicount{Ambi2DChannelsFromOrder(decoder.mOrder)};
        std::transform(AmbiIndex::From2D.begin(), AmbiIndex::From2D.begin()+ambicount,
            std::begin(device->Dry.AmbiMap),
            [](const uint8_t &index) noexcept { return BFChannelConfig{1.0f, index}; }
        );
        AllocChannels(device, ambicount, device->channelsFromFmt());

        std::unique_ptr<FrontStablizer> stablizer;
        if(stablize)
        {
            /* Only enable the stablizer if the decoder does not output to the
             * front-center channel.
             */
            const auto cidx = device->RealOut.ChannelIndex[FrontCenter];
            bool hasfc{false};
            if(cidx < chancoeffs.size())
            {
                for(const auto &coeff : chancoeffs[cidx])
                    hasfc |= coeff != 0.0f;
            }
            if(!hasfc && cidx < chancoeffslf.size())
            {
                for(const auto &coeff : chancoeffslf[cidx])
                    hasfc |= coeff != 0.0f;
            }
            if(!hasfc)
            {
                stablizer = CreateStablizer(device->channelsFromFmt(), device->Frequency);
                TRACE("Front stablizer enabled\n");
            }
        }

        TRACE("Enabling %s-band %s-order%s ambisonic decoder\n",
            !dual_band ? "single" : "dual",
            (decoder.mOrder > 2) ? "third" :
            (decoder.mOrder > 1) ? "second" : "first",
            "");
        device->AmbiDecoder = BFormatDec::Create(ambicount, chancoeffs, chancoeffslf,
            std::move(stablizer));
    }
}